

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

NETRCcode Curl_parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,
                         char *netrcfile)

{
  NETRCcode NVar1;
  __uid_t __uid;
  int iVar2;
  passwd *ppVar3;
  char *netrcfile_00;
  passwd *ppVar4;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  passwd *local_470;
  passwd local_468;
  char local_438 [1032];
  
  if (netrcfile != (char *)0x0) {
    NVar1 = parsenetrc(store,host,loginp,passwordp,netrcfile);
    return NVar1;
  }
  ppVar3 = (passwd *)curl_getenv("HOME");
  ppVar4 = ppVar3;
  if (ppVar3 == (passwd *)0x0) {
    __uid = geteuid();
    iVar2 = getpwuid_r(__uid,&local_468,local_438,0x400,&local_470);
    if (local_470 != (passwd *)0x0) {
      local_470 = (passwd *)local_468.pw_dir;
    }
    ppVar4 = (passwd *)0x0;
    if (iVar2 == 0) {
      ppVar4 = local_470;
    }
  }
  if (ppVar4 == (passwd *)0x0) {
    NVar1 = NETRC_FILE_MISSING;
  }
  else {
    netrcfile_00 = curl_maprintf("%s%s.netrc",ppVar4,"/");
    if (netrcfile_00 == (char *)0x0) {
      NVar1 = NETRC_OUT_OF_MEMORY;
    }
    else {
      NVar1 = parsenetrc(store,host,loginp,passwordp,netrcfile_00);
      (*Curl_cfree)(netrcfile_00);
    }
    (*Curl_cfree)(ppVar3);
  }
  return NVar1;
}

Assistant:

NETRCcode Curl_parsenetrc(struct store_netrc *store, const char *host,
                          char **loginp, char **passwordp,
                          char *netrcfile)
{
  NETRCcode retcode = NETRC_OK;
  char *filealloc = NULL;

  if(!netrcfile) {
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    char pwbuf[1024];
#endif
    char *home = NULL;
    char *homea = curl_getenv("HOME"); /* portable environment reader */
    if(homea) {
      home = homea;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = pw.pw_dir;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#elif defined(_WIN32)
    }
    else {
      homea = curl_getenv("USERPROFILE");
      if(homea) {
        home = homea;
      }
#endif
    }

    if(!home)
      return NETRC_FILE_MISSING; /* no home directory found (or possibly out
                                    of memory) */

    filealloc = aprintf("%s%s.netrc", home, DIR_CHAR);
    if(!filealloc) {
      free(homea);
      return NETRC_OUT_OF_MEMORY;
    }
    retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
    free(filealloc);
#ifdef _WIN32
    if(retcode == NETRC_FILE_MISSING) {
      /* fallback to the old-style "_netrc" file */
      filealloc = aprintf("%s%s_netrc", home, DIR_CHAR);
      if(!filealloc) {
        free(homea);
        return NETRC_OUT_OF_MEMORY;
      }
      retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
      free(filealloc);
    }
#endif
    free(homea);
  }